

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> * __thiscall
pbrt::ParameterDictionary::GetRGBArray
          (vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  byte bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *pvVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar11;
  undefined1 auVar12 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar23 [64];
  allocator_type local_39;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar11 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar11 = paVar1;
  }
  local_38 = __return_storage_ptr__;
  if (sVar2 != 0) {
    lVar9 = 0;
    do {
      pcVar3 = *(char **)((long)paVar11 + lVar9);
      __n = *(size_t *)(pcVar3 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar8 = bcmp(*(void **)(pcVar3 + 0x20),(name->_M_dataplus)._M_p,__n), iVar8 == 0)) &&
          (iVar8 = std::__cxx11::string::compare(pcVar3), pvVar7 = local_38, iVar8 == 0)))) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(pcVar3 + 0x70);
        if (SUB168(ZEXT816(0xaaaaaaaaaaaaaaab) * auVar6,0) < 0x5555555555555556) {
          std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::vector
                    (local_38,*(ulong *)(pcVar3 + 0x70) / 3,&local_39);
          if (2 < *(ulong *)(pcVar3 + 0x70)) {
            auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar16 = vpbroadcastq_avx512f(ZEXT816(0xc));
            auVar17 = vpbroadcastq_avx512f(ZEXT816(8));
            lVar9 = *(long *)(pcVar3 + 0x60);
            uVar10 = *(ulong *)(pcVar3 + 0x70) / 3 + 7 & 0xfffffffffffffff8;
            auVar18 = vpbroadcastq_avx512f();
            auVar19 = vpbroadcastq_avx512f();
            do {
              auVar20 = vpaddq_avx512f(auVar15,auVar15);
              uVar5 = vpcmpuq_avx512f(auVar15,auVar18,2);
              uVar10 = uVar10 - 8;
              vpaddq_avx512f(auVar20,auVar15);
              auVar20 = vgatherqpd_avx512f(*(undefined8 *)(lVar9 + sVar2 * 0x40));
              bVar4 = (byte)uVar5;
              auVar23._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar20._8_8_;
              auVar23._0_8_ = (ulong)(bVar4 & 1) * auVar20._0_8_;
              auVar23._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar20._16_8_;
              auVar23._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar20._24_8_;
              auVar23._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar20._32_8_;
              auVar23._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar20._40_8_;
              auVar23._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar20._48_8_;
              auVar23._56_8_ = (uVar5 >> 7) * auVar20._56_8_;
              auVar20 = vgatherqpd_avx512f(*(undefined8 *)(lVar9 + 8 + sVar2 * 0x40));
              auVar21._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar20._8_8_;
              auVar21._0_8_ = (ulong)(bVar4 & 1) * auVar20._0_8_;
              auVar21._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar20._16_8_;
              auVar21._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar20._24_8_;
              auVar21._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar20._32_8_;
              auVar21._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar20._40_8_;
              auVar21._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar20._48_8_;
              auVar21._56_8_ = (uVar5 >> 7) * auVar20._56_8_;
              auVar20 = vgatherqpd_avx512f(*(undefined8 *)(lVar9 + 0x10 + sVar2 * 0x40));
              auVar22._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar20._8_8_;
              auVar22._0_8_ = (ulong)(bVar4 & 1) * auVar20._0_8_;
              auVar22._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar20._16_8_;
              auVar22._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar20._24_8_;
              auVar22._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar20._32_8_;
              auVar22._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar20._40_8_;
              auVar22._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar20._48_8_;
              auVar22._56_8_ = (uVar5 >> 7) * auVar20._56_8_;
              auVar12 = vcvtpd2ps_avx512f(auVar23);
              auVar13 = vcvtpd2ps_avx512f(auVar21);
              auVar14 = vcvtpd2ps_avx512f(auVar22);
              auVar20 = vpmullq_avx512dq(auVar15,auVar16);
              auVar15 = vpaddq_avx512f(auVar15,auVar17);
              auVar23 = vpaddq_avx512f(auVar19,auVar20);
              vscatterqps_avx512f(ZEXT864((pvVar7->
                                          super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)
                                          ._M_impl.super__Vector_impl_data._M_start) + auVar20,uVar5
                                  ,auVar12);
              vscatterqps_avx512f(ZEXT864(4) + auVar23,uVar5,auVar13);
              vscatterqps_avx512f(ZEXT864(8) + auVar23,uVar5,auVar14);
            } while (uVar10 != 0);
          }
          pcVar3[0xb8] = '\x01';
          return pvVar7;
        }
        ErrorExit((FileLoc *)(pcVar3 + 0x40),
                  "Number of values given for \"rgb\" parameter %d \"name\" isn\'t a multiple of 3."
                 );
      }
      lVar9 = lVar9 + 8;
    } while (sVar2 << 3 != lVar9);
  }
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_38;
}

Assistant:

std::vector<RGB> ParameterDictionary::GetRGBArray(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() % 3)
                ErrorExit(&p->loc, "Number of values given for \"rgb\" parameter %d "
                                   "\"name\" isn't a multiple of 3.");

            std::vector<RGB> rgb(p->numbers.size() / 3);
            for (int i = 0; i < p->numbers.size() / 3; ++i)
                rgb[i] =
                    RGB(p->numbers[3 * i], p->numbers[3 * i + 1], p->numbers[3 * i + 2]);

            p->lookedUp = true;
            return rgb;
        }
    }
    return {};
}